

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGetOptionalObjectMethod
               (RegSlot methodReg,RegSlot objectReg,PropertyId propertyId,
               ByteCodeLabel noMethodLabel,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId_00;
  ByteCodeWriter *pBVar1;
  uint cacheId;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ByteCodeLabel noMethodLabel_local;
  PropertyId propertyId_local;
  RegSlot objectReg_local;
  RegSlot methodReg_local;
  
  cacheId_00 = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,true,false);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::PatchableProperty(pBVar1,LdFld,methodReg,objectReg,cacheId_00,false,true);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::BrReg2
            (pBVar1,BrEq_A,noMethodLabel,methodReg,funcInfo->undefinedConstantRegister);
  return;
}

Assistant:

void EmitGetOptionalObjectMethod(
    Js::RegSlot methodReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    Js::ByteCodeLabel noMethodLabel,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ true,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdFld,
        methodReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ true);

    byteCodeGenerator->Writer()->BrReg2(
        Js::OpCode::BrEq_A,
        noMethodLabel,
        methodReg,
        funcInfo->undefinedConstantRegister);
}